

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_allocator_adaptor.hpp
# Opt level: O0

pointer __thiscall
boost::alignment::
aligned_allocator_adaptor<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>,_64UL>
::allocate(aligned_allocator_adaptor<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>,_64UL>
           *this,size_type size)

{
  char *pcVar1;
  long in_RSI;
  aligned_allocator_adaptor<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>,_64UL>
  *in_RDI;
  void *r;
  char_ptr p;
  char_alloc a;
  size_t n;
  size_t s;
  allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>
  *in_stack_ffffffffffffff98;
  allocator<char> *in_stack_ffffffffffffffa0;
  allocator<char> *__n;
  new_allocator<char> *in_stack_ffffffffffffffb0;
  pointer local_48 [3];
  char *local_30;
  allocator<char> local_21;
  size_t local_20;
  size_t local_18;
  
  local_18 = in_RSI * 0x40;
  local_20 = local_18 + 0x3f;
  base(in_RDI);
  __n = &local_21;
  std::allocator<char>::
  allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_30 = __gnu_cxx::new_allocator<char>::allocate
                       (in_stack_ffffffffffffffb0,(size_type)__n,in_stack_ffffffffffffffa0);
  pcVar1 = to_address<char>(local_30);
  local_48[0] = (pointer)(pcVar1 + 8);
  std::align(0x40,local_18,local_48,&local_20);
  *(char **)&local_48[0][-1].field_0x38 = local_30;
  std::allocator<char>::~allocator(&local_21);
  return local_48[0];
}

Assistant:

pointer allocate(size_type size) {
        enum {
            m = min_align<value_type>::value
        };
        std::size_t s = size * sizeof(value_type);
        std::size_t n = s + m - 1;
        char_alloc a(base());
        char_ptr p = a.allocate(sizeof p + n);
        void* r = boost::to_address(p) + sizeof p;
        (void)boost::alignment::align(m, s, r, n);
        ::new(static_cast<void*>(static_cast<char_ptr*>(r) - 1)) char_ptr(p);
        return static_cast<pointer>(r);
    }